

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::checkFramebufferRenderable
               (TestLog *log,RenderContext *renderCtx,GLuint framebuffer,IVec2 *size)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  TestError *pTVar8;
  MessageBuilder *pMVar9;
  MessageBuilder local_708;
  MessageBuilder local_588;
  int local_404;
  undefined4 local_400;
  GLuint passed;
  GLuint vertexBuffer;
  GLuint vertexArray;
  float data [12];
  MessageBuilder local_3c0;
  undefined4 local_240;
  allocator<char> local_239;
  GLuint query;
  allocator<char> local_201;
  string local_200;
  ProgramSources local_1e0;
  undefined1 local_110 [8];
  ShaderProgram program;
  char *fragmentSource;
  char *vertexSource;
  Functions *gl;
  IVec2 *size_local;
  GLuint framebuffer_local;
  RenderContext *renderCtx_local;
  TestLog *log_local;
  long lVar7;
  
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  program.m_program.m_info.linkTimeUs = (deUint64)anon_var_dwarf_1c445d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "#version 310 es\nin layout(location = 0) highp vec2 a_position;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&query,
             "#version 310 es\nout layout(location = 0) mediump vec4 f_color;\n\nvoid main()\n{\n\tf_color = vec4(1.0, 0.5, 0.25, 1.0);\n}\n"
             ,&local_239);
  glu::makeVtxFragSources(&local_1e0,&local_200,(string *)&query);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_110,renderCtx,&local_1e0);
  glu::ProgramSources::~ProgramSources(&local_1e0);
  std::__cxx11::string::~string((string *)&query);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  local_240 = 0;
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_110);
  if (!bVar2) {
    glu::operator<<(log,(ShaderProgram *)local_110);
  }
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 &&
         (bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_110), bVar2))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      pcVar1 = *(code **)(lVar7 + 0x1680);
      dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_110);
      (*pcVar1)(dVar5);
      (**(code **)(lVar7 + 0x5e0))(0xb71);
      (**(code **)(lVar7 + 0x4a0))(0x207);
      (**(code **)(lVar7 + 0x78))(0x8ca9,framebuffer);
      pcVar1 = *(code **)(lVar7 + 0x1a00);
      iVar3 = tcu::Vector<int,_2>::x(size);
      iVar6 = tcu::Vector<int,_2>::y(size);
      (*pcVar1)(0,0,iVar3,iVar6);
      while ((dVar4 = ::deGetFalse(), dVar4 == 0 &&
             (iVar3 = (**(code **)(lVar7 + 0x170))(0x8ca9), iVar3 == 0x8cd5))) {
        dVar4 = ::deGetFalse();
        if (dVar4 == 0) {
          tcu::TestLog::operator<<(&local_3c0,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_3c0,
                              (char (*) [97])
                              "Rendering full framebuffer quad with color ouput, verifying output presence with occlusion query"
                             );
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3c0);
          data[6] = 1.0;
          data[7] = -1.0;
          data[8] = -1.0;
          data[9] = -1.0;
          data[2] = -1.0;
          data[3] = 1.0;
          data[4] = -1.0;
          data[5] = 1.0;
          vertexBuffer = 0x3f800000;
          vertexArray = 0x3f800000;
          data[0] = 1.0;
          data[1] = -1.0;
          passed = 0;
          local_400 = 0;
          (**(code **)(lVar7 + 0x6e0))(1,&local_240);
          (**(code **)(lVar7 + 0x708))(1,&passed);
          (**(code **)(lVar7 + 0xd8))(passed);
          (**(code **)(lVar7 + 0x6c8))(1,&local_400);
          (**(code **)(lVar7 + 0x40))(0x8892,local_400);
          (**(code **)(lVar7 + 0x150))(0x8892,0x30,&vertexBuffer,0x88e4);
          (**(code **)(lVar7 + 0x610))(0);
          (**(code **)(lVar7 + 0x19f0))(0,2,0x1406,0,0,0);
          (**(code **)(lVar7 + 0x20))(0x8c2f,local_240);
          (**(code **)(lVar7 + 0x538))(4,0,6);
          (**(code **)(lVar7 + 0x628))(0x8c2f);
          (**(code **)(lVar7 + 0x518))(0);
          (**(code **)(lVar7 + 0x40))(0x8892,0);
          (**(code **)(lVar7 + 0xd8))(0);
          (**(code **)(lVar7 + 0x438))(1,&local_400);
          (**(code **)(lVar7 + 0x490))(1,&passed);
          local_404 = 0;
          (**(code **)(lVar7 + 0xa20))(local_240,0x8866,&local_404);
          (**(code **)(lVar7 + 0x458))(1,&local_240);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"Query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
                          ,0xfe);
          if (local_404 == 0) {
            tcu::TestLog::operator<<(&local_708,log,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<(&local_708,(char (*) [19])"Query did not pass")
            ;
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_708);
          }
          else {
            tcu::TestLog::operator<<(&local_588,log,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<(&local_588,(char (*) [13])"Query passed");
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_588);
          }
          bVar2 = local_404 != 0;
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
          return bVar2;
        }
      }
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,(char *)0x0,
                 "gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
                 ,0xce);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,(char *)0x0,"program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
             ,0xc6);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool checkFramebufferRenderable (TestLog& log, const glu::RenderContext& renderCtx, GLuint framebuffer, const IVec2& size)
{
	const glw::Functions&		gl				= renderCtx.getFunctions();

	const char* const			vertexSource	= "#version 310 es\n"
												  "in layout(location = 0) highp vec2 a_position;\n\n"
												  "void main()\n"
												  "{\n"
												  "	gl_Position = vec4(a_position, 0.0, 1.0);\n"
												  "}\n";

	const char* const			fragmentSource	= "#version 310 es\n"
												  "out layout(location = 0) mediump vec4 f_color;\n\n"
												  "void main()\n"
												  "{\n"
												  "	f_color = vec4(1.0, 0.5, 0.25, 1.0);\n"
												  "}\n";

	const glu::ShaderProgram	program			(renderCtx, glu::makeVtxFragSources(vertexSource, fragmentSource));
	GLuint						query			= 0;

	if (!program.isOk())
		log << program;

	TCU_CHECK(program.isOk());

	gl.useProgram(program.getProgram());
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_ALWAYS);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, framebuffer);
	gl.viewport(0, 0, size.x(), size.y());

	TCU_CHECK(gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	log << TestLog::Message << "Rendering full framebuffer quad with color ouput, verifying output presence with occlusion query" << TestLog::EndMessage;

	// Render
	{
		const float data[] =
		{
			 1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f,  1.0f,
			-1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f, -1.0f,
		};

		GLuint vertexArray	= 0;
		GLuint vertexBuffer	= 0;

		gl.genQueries(1, &query);
		gl.genVertexArrays(1, &vertexArray);
		gl.bindVertexArray(vertexArray);

		gl.genBuffers(1, &vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		gl.enableVertexAttribArray(0);
		gl.vertexAttribPointer(0, 2, GL_FLOAT, false, 0, DE_NULL);

		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);

		gl.disableVertexAttribArray(0);
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteBuffers(1, &vertexBuffer);
		gl.deleteVertexArrays(1, &vertexArray);
	}

	// Read
	{
		GLuint passed = 0;

		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &passed);
		gl.deleteQueries(1, &query);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		if (passed)
			log << TestLog::Message << "Query passed" << TestLog::EndMessage;
		else
			log << TestLog::Message << "Query did not pass" << TestLog::EndMessage;

		return passed != 0;
	}
}